

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O3

void __thiscall cmQtAutoGeneratorRcc::SettingsFileWrite(cmQtAutoGeneratorRcc *this)

{
  Logger *this_00;
  FileSystem *this_01;
  string *filename;
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  string content;
  string local_70;
  string local_50;
  
  if (this->SettingsChanged_ == true) {
    this_00 = &(this->super_cmQtAutoGenerator).Logger_;
    if ((this->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
      cmQtAutoGen::Quoted(&local_50,&this->SettingsFile_);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x4b2fe3);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_70.field_2._M_allocated_capacity = *psVar3;
        local_70.field_2._8_8_ = plVar2[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar3;
        local_70._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_70._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      cmQtAutoGenerator::Logger::Info(this_00,RCC,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rcc:","");
    std::__cxx11::string::_M_append
              ((char *)&local_70,(ulong)(this->SettingsString_)._M_dataplus._M_p);
    std::__cxx11::string::push_back((char)&local_70);
    this_01 = &(this->super_cmQtAutoGenerator).FileSys_;
    filename = &this->SettingsFile_;
    bVar1 = cmQtAutoGenerator::FileSystem::FileWrite(this_01,RCC,filename,&local_70);
    if (!bVar1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Settings file writing failed","");
      cmQtAutoGenerator::Logger::ErrorFile(this_00,RCC,filename,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmQtAutoGenerator::FileSystem::FileRemove(this_01,filename);
      this->Error_ = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  cmFileLock::Release(&this->LockFileLock_);
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::SettingsFileWrite()
{
  // Only write if any setting changed
  if (SettingsChanged_) {
    if (Log().Verbose()) {
      Log().Info(GenT::RCC, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Write settings file
    std::string content = "rcc:";
    content += SettingsString_;
    content += '\n';
    if (!FileSys().FileWrite(GenT::RCC, SettingsFile_, content)) {
      Log().ErrorFile(GenT::RCC, SettingsFile_,
                      "Settings file writing failed");
      // Remove old settings file to trigger a full rebuild on the next run
      FileSys().FileRemove(SettingsFile_);
      Error_ = true;
    }
  }

  // Unlock the lock file
  LockFileLock_.Release();
}